

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

string * pstore::path::win32::dir_name(string *__return_storage_ptr__,string *src_path)

{
  pointer pcVar1;
  string p;
  string drive;
  undefined1 *local_b8;
  long local_b0;
  undefined1 local_a8;
  undefined7 uStack_a7;
  undefined1 local_98 [32];
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  string local_58;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_b0 = 0;
  local_a8 = 0;
  local_b8 = &local_a8;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  split_drive((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_98,src_path);
  std::__cxx11::string::operator=((string *)&local_58,(string *)local_98);
  std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
  }
  pcVar1 = local_98 + 0x10;
  if ((pointer)local_98._0_8_ != pcVar1) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
  }
  std::__cxx11::string::find_last_of((char *)&local_b8,0x142f69,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)local_98,(ulong)&local_b8);
  std::__cxx11::string::operator=((string *)&local_b8,(string *)local_98);
  if ((pointer)local_98._0_8_ != pcVar1) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
  }
  local_98._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>((string *)local_98,local_b8,local_b8 + local_b0);
  local_38._M_len = 1;
  local_38._M_array = (iterator)local_98;
  join(__return_storage_ptr__,&local_58,&local_38);
  if ((pointer)local_98._0_8_ != pcVar1) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string dir_name (std::string const & src_path) {
                std::string drive;
                std::string p;
                std::tie (drive, p) = path::win32::split_drive (src_path);

                std::string::size_type const pos = p.find_last_of (R"(/\)");
                p = p.substr (0, (pos == std::string::npos) ? 0 : pos + 1);
                return path::win32::join (drive, p);
            }